

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isEarHashed(Earcut<unsigned_int> *this,Node *ear)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Node *pNVar8;
  Node *pNVar9;
  bool bVar10;
  int32_t iVar11;
  int32_t iVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  pNVar8 = ear->prev;
  pNVar9 = ear->next;
  dVar4 = ear->x;
  dVar5 = ear->y;
  dVar6 = pNVar8->x;
  dVar7 = pNVar8->y;
  dVar21 = pNVar9->x;
  dVar20 = pNVar9->y;
  if (0.0 <= (dVar21 - dVar4) * (dVar5 - dVar7) - (dVar20 - dVar5) * (dVar4 - dVar6)) {
LAB_0014a089:
    bVar10 = false;
  }
  else {
    pdVar1 = &pNVar8->y;
    pdVar3 = &pNVar9->x;
    pdVar2 = &ear->x;
    pdVar19 = &pNVar8->x;
    pdVar18 = &pNVar9->y;
    dVar22 = dVar21;
    pdVar13 = pdVar3;
    if (dVar4 <= dVar21) {
      dVar22 = dVar4;
      pdVar13 = pdVar2;
    }
    if (dVar6 <= dVar22) {
      pdVar13 = pdVar19;
    }
    pdVar17 = &ear->y;
    dVar22 = dVar20;
    pdVar15 = pdVar18;
    if (dVar5 <= dVar20) {
      dVar22 = dVar5;
      pdVar15 = pdVar17;
    }
    if (dVar7 <= dVar22) {
      pdVar15 = pdVar1;
    }
    pdVar16 = pdVar3;
    if (dVar21 <= dVar4) {
      dVar21 = dVar4;
      pdVar16 = pdVar2;
    }
    if (dVar21 <= dVar6) {
      pdVar16 = pdVar19;
    }
    pdVar14 = pdVar17;
    if (dVar5 < dVar20) {
      pdVar14 = pdVar18;
    }
    dVar4 = *pdVar16;
    if (dVar20 <= dVar5) {
      dVar20 = dVar5;
    }
    if (dVar20 <= dVar7) {
      pdVar14 = pdVar1;
    }
    dVar5 = *pdVar14;
    iVar11 = zOrder(this,*pdVar13,*pdVar15);
    iVar12 = zOrder(this,dVar4,dVar5);
    for (pNVar8 = ear->nextZ; (pNVar8 != (Node *)0x0 && (pNVar8->z <= iVar12));
        pNVar8 = pNVar8->nextZ) {
      if ((pNVar8 != ear->prev) && (pNVar8 != ear->next)) {
        dVar4 = pNVar8->x;
        dVar5 = pNVar8->y;
        if (0.0 <= (*pdVar3 - dVar4) * (*pdVar1 - dVar5) - (*pdVar18 - dVar5) * (*pdVar19 - dVar4))
        {
          if (((0.0 <= (*pdVar19 - dVar4) * (*pdVar17 - dVar5) -
                       (*pdVar1 - dVar5) * (*pdVar2 - dVar4)) &&
              (0.0 <= (*pdVar2 - dVar4) * (*pdVar18 - dVar5) -
                      (*pdVar17 - dVar5) * (*pdVar3 - dVar4))) &&
             (0.0 <= (pNVar8->next->x - dVar4) * (dVar5 - pNVar8->prev->y) -
                     (pNVar8->next->y - dVar5) * (dVar4 - pNVar8->prev->x))) goto LAB_0014a089;
        }
      }
    }
    bVar10 = true;
    for (pNVar8 = ear->prevZ; (pNVar8 != (Node *)0x0 && (iVar11 <= pNVar8->z));
        pNVar8 = pNVar8->prevZ) {
      if ((pNVar8 != ear->prev) && (pNVar8 != ear->next)) {
        dVar4 = pNVar8->x;
        dVar5 = pNVar8->y;
        if (0.0 <= (*pdVar3 - dVar4) * (*pdVar1 - dVar5) - (*pdVar18 - dVar5) * (*pdVar19 - dVar4))
        {
          if (((0.0 <= (*pdVar19 - dVar4) * (*pdVar17 - dVar5) -
                       (*pdVar1 - dVar5) * (*pdVar2 - dVar4)) &&
              (0.0 <= (*pdVar2 - dVar4) * (*pdVar18 - dVar5) -
                      (*pdVar17 - dVar5) * (*pdVar3 - dVar4))) &&
             (0.0 <= (pNVar8->next->x - dVar4) * (dVar5 - pNVar8->prev->y) -
                     (pNVar8->next->y - dVar5) * (dVar4 - pNVar8->prev->x))) goto LAB_0014a089;
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool Earcut<N>::isEarHashed(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // triangle bbox; min & max are calculated like this for speed
    const double minTX = std::min<double>(a->x, std::min<double>(b->x, c->x));
    const double minTY = std::min<double>(a->y, std::min<double>(b->y, c->y));
    const double maxTX = std::max<double>(a->x, std::max<double>(b->x, c->x));
    const double maxTY = std::max<double>(a->y, std::max<double>(b->y, c->y));

    // z-order range for the current triangle bbox;
    const int32_t minZ = zOrder(minTX, minTY);
    const int32_t maxZ = zOrder(maxTX, maxTY);

    // first look for points inside the triangle in increasing z-order
    Node* p = ear->nextZ;

    while (p && p->z <= maxZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->nextZ;
    }

    // then look for points in decreasing z-order
    p = ear->prevZ;

    while (p && p->z >= minZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->prevZ;
    }

    return true;
}